

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rifiuti.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  int iVar2;
  GQuark GVar3;
  GQuark GVar4;
  exitcode eVar5;
  undefined8 uVar6;
  GError *pGVar7;
  GError *new_err;
  GError *error;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  new_err = (GError *)0x0;
  error = (GError *)argv;
  argv_local._0_4_ = argc;
  _Var1 = rifiuti_init(RECYCLE_BIN_TYPE_FILE,"INFO2","Parse INFO2 file and dump recycle bin data.",
                       (char ***)&error,&new_err);
  if (_Var1) {
    do_parse_records(_parse_record_cb);
    if ((meta->records->len == 0) && (iVar2 = g_hash_table_size(meta->invalid_records), iVar2 != 0))
    {
      GVar3 = rifiuti_fatal_error_quark();
      uVar6 = gettext("No valid recycle bin record found");
      g_set_error_literal(&new_err,GVar3,1,uVar6);
    }
    else {
      _Var1 = dump_content(&new_err);
      if (!_Var1) {
        GVar3 = new_err->domain;
        GVar4 = g_file_error_quark();
        if (GVar3 != GVar4) {
          g_assertion_message_expr
                    ("rifiuti2",
                     "/workspace/llm4binary/github/license_c_cmakelists/abelcheung[P]rifiuti2/src/rifiuti.c"
                     ,0x185,"main","error->domain == G_FILE_ERROR");
        }
        GVar3 = rifiuti_fatal_error_quark();
        uVar6 = g_strdup(new_err->message);
        pGVar7 = (GError *)g_error_new_literal(GVar3,2,uVar6);
        g_error_free(new_err);
        new_err = pGVar7;
      }
    }
  }
  eVar5 = rifiuti_cleanup(&new_err);
  return eVar5;
}

Assistant:

int
main (int    argc,
      char **argv)
{
    GError *error = NULL;

    UNUSED (argc);

    if (! rifiuti_init (
        RECYCLE_BIN_TYPE_FILE,
        N_("INFO2"),
        N_("Parse INFO2 file and dump recycle bin data."),
        &argv, &error
    ))
        goto cleanup;

    do_parse_records (&_parse_record_cb);

    if (! meta->records->len && g_hash_table_size (meta->invalid_records))
    {
        g_set_error_literal (&error, R2_FATAL_ERROR,
            R2_FATAL_ERROR_ILLEGAL_DATA,
            _("No valid recycle bin record found"));
        goto cleanup;
    }

    if (! dump_content (&error))
    {
        g_assert (error->domain == G_FILE_ERROR);
        GError *new_err = g_error_new_literal (
            R2_FATAL_ERROR, R2_FATAL_ERROR_TEMPFILE,
            g_strdup (error->message));
        g_error_free (error);
        error = new_err;
    }

    cleanup:

    return rifiuti_cleanup (&error);
}